

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O3

int check_next2(LexState *ls,char *set)

{
  size_t sVar1;
  int c;
  ZIO *z;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  
  c = ls->current;
  if ((c == *set) || (iVar3 = 0, c == set[1])) {
    save(ls,c);
    z = ls->z;
    sVar1 = z->n;
    z->n = z->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(z);
    }
    else {
      pbVar2 = (byte *)z->p;
      z->p = (char *)(pbVar2 + 1);
      uVar4 = (uint)*pbVar2;
    }
    ls->current = uVar4;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}